

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long_double>::Multiply
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *A,TPZFMatrix<long_double> *B,
          int opt)

{
  int64_t iVar1;
  int64_t iVar2;
  ostream *poVar3;
  uint in_ECX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  TPZFMatrix<long_double> *in_stack_ffffffffffffff88;
  
  if (in_ECX == 0) {
    iVar1 = TPZBaseMatrix::Rows(in_RDX);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols(in_RDX);
      iVar2 = TPZBaseMatrix::Cols(in_RSI);
      if (iVar1 == iVar2) goto LAB_012c7741;
    }
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(in_RSI);
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xe])(in_RDX,iVar1,iVar2);
    goto LAB_012c783b;
  }
LAB_012c7741:
  if (in_ECX == 0) {
LAB_012c77df:
    if ((in_ECX != 0) && (in_RDI->fDecomposed != '\0')) {
      std::operator<<((ostream *)&std::cerr,
                      "virtual void TPZMatrix<long double>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = long double]"
                     );
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "\nERROR: Cannot multiply with opt when matrix is decomposed");
      std::operator<<(poVar3,"\nAborting...\n");
      pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
    }
  }
  else {
    iVar1 = TPZBaseMatrix::Rows(in_RDX);
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols(in_RDX);
      iVar2 = TPZBaseMatrix::Cols(in_RSI);
      if (iVar1 == iVar2) goto LAB_012c77df;
    }
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(in_RSI);
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xe])(in_RDX,iVar1,iVar2);
  }
LAB_012c783b:
  switch(in_RDI->fDecomposed) {
  case '\0':
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x27])(in_RDI,in_RSI,in_RDX,in_RDX,(ulong)in_ECX);
    break;
  case '\x01':
    TPZFMatrix<long_double>::operator=
              (in_stack_ffffffffffffff88,
               (TPZFMatrix<long_double> *)
               CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x43])(in_RDI,in_RDX);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZMatrix<long double>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = long double]"
                   );
    poVar3 = std::operator<<((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:");
    poVar3 = std::operator<<(poVar3,in_RDI->fDecomposed);
    std::operator<<(poVar3,"\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
    break;
  case '\x03':
    TPZFMatrix<long_double>::operator=
              (in_stack_ffffffffffffff88,
               (TPZFMatrix<long_double> *)
               CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x44])(in_RDI,in_RDX);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x45])(in_RDI,in_RDX);
    break;
  case '\x04':
    TPZFMatrix<long_double>::operator=
              (in_stack_ffffffffffffff88,
               (TPZFMatrix<long_double> *)
               CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x46])(in_RDI,in_RDX);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x48])(in_RDI,in_RDX);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x47])(in_RDI,in_RDX);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}